

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O3

void __thiscall
cmRuntimeDependencyArchive::cmRuntimeDependencyArchive
          (cmRuntimeDependencyArchive *this,cmCommand *command,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *searchDirectories,string *bundleExecutable,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *preIncludeRegexes,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *preExcludeRegexes,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *postIncludeRegexes,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *postExcludeRegexes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  pointer pbVar4;
  undefined8 uVar5;
  allocator_type local_6c;
  allocator_type local_6b;
  allocator_type local_6a;
  allocator_type local_69;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *local_58;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *local_50;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_40;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *local_38;
  
  this->Command = command;
  (this->Linker)._M_t.
  super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
  super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
  super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl = (cmBinUtilsLinker *)0x0;
  local_60 = &(this->GetRuntimeDependenciesTool).field_2;
  (this->GetRuntimeDependenciesTool)._M_dataplus._M_p = (pointer)local_60;
  (this->GetRuntimeDependenciesTool)._M_string_length = 0;
  (this->GetRuntimeDependenciesTool).field_2._M_local_buf[0] = '\0';
  (this->GetRuntimeDependenciesCommand).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GetRuntimeDependenciesCommand).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->GetRuntimeDependenciesCommand).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar4 = (searchDirectories->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->SearchDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (searchDirectories->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->SearchDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
  (this->SearchDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (searchDirectories->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (searchDirectories->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (searchDirectories->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (searchDirectories->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = &(this->BundleExecutable).field_2;
  (this->BundleExecutable)._M_dataplus._M_p = (pointer)local_68;
  pcVar3 = (bundleExecutable->_M_dataplus)._M_p;
  paVar1 = &bundleExecutable->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar5 = *(undefined8 *)((long)&bundleExecutable->field_2 + 8);
    local_68->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->BundleExecutable).field_2 + 8) = uVar5;
  }
  else {
    (this->BundleExecutable)._M_dataplus._M_p = pcVar3;
    (this->BundleExecutable).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->BundleExecutable)._M_string_length = bundleExecutable->_M_string_length;
  (bundleExecutable->_M_dataplus)._M_p = (pointer)paVar1;
  bundleExecutable->_M_string_length = 0;
  (bundleExecutable->field_2)._M_local_buf[0] = '\0';
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&this->PreIncludeRegexes,
             (long)(preIncludeRegexes->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(preIncludeRegexes->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,&local_69);
  local_50 = &this->PreExcludeRegexes;
  local_38 = &this->PreIncludeRegexes;
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (local_50,(long)(preExcludeRegexes->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(preExcludeRegexes->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5,&local_6a);
  local_58 = &this->PostIncludeRegexes;
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (local_58,(long)(postIncludeRegexes->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(postIncludeRegexes->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5,&local_6b);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&this->PostExcludeRegexes,
             (long)(postExcludeRegexes->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(postExcludeRegexes->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,&local_6c);
  local_40 = &this->ResolvedPaths;
  p_Var2 = &(this->ResolvedPaths)._M_t._M_impl.super__Rb_tree_header;
  (this->ResolvedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ResolvedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ResolvedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->ResolvedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->ResolvedPaths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = &this->UnresolvedPaths;
  p_Var2 = &(this->UnresolvedPaths)._M_t._M_impl.super__Rb_tree_header;
  (this->UnresolvedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UnresolvedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UnresolvedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->UnresolvedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header
  ;
  (this->UnresolvedPaths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<cmsys::RegularExpression*,std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>>,cmsys::RegularExpression(*)(std::__cxx11::string_const&)>
            ((preIncludeRegexes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (preIncludeRegexes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (this->PreIncludeRegexes).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_start,TransformCompile);
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<cmsys::RegularExpression*,std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>>,cmsys::RegularExpression(*)(std::__cxx11::string_const&)>
            ((preExcludeRegexes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (preExcludeRegexes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (local_50->
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             )._M_impl.super__Vector_impl_data._M_start,TransformCompile);
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<cmsys::RegularExpression*,std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>>,cmsys::RegularExpression(*)(std::__cxx11::string_const&)>
            ((postIncludeRegexes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (postIncludeRegexes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (local_58->
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             )._M_impl.super__Vector_impl_data._M_start,TransformCompile);
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<cmsys::RegularExpression*,std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>>,cmsys::RegularExpression(*)(std::__cxx11::string_const&)>
            ((postExcludeRegexes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (postExcludeRegexes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (this->PostExcludeRegexes).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_start,TransformCompile);
  return;
}

Assistant:

cmRuntimeDependencyArchive::cmRuntimeDependencyArchive(
  cmCommand* command, std::vector<std::string> searchDirectories,
  std::string bundleExecutable,
  const std::vector<std::string>& preIncludeRegexes,
  const std::vector<std::string>& preExcludeRegexes,
  const std::vector<std::string>& postIncludeRegexes,
  const std::vector<std::string>& postExcludeRegexes)
  : Command(command)
  , SearchDirectories(std::move(searchDirectories))
  , BundleExecutable(std::move(bundleExecutable))
  , PreIncludeRegexes(preIncludeRegexes.size())
  , PreExcludeRegexes(preExcludeRegexes.size())
  , PostIncludeRegexes(postIncludeRegexes.size())
  , PostExcludeRegexes(postExcludeRegexes.size())
{
  std::transform(preIncludeRegexes.begin(), preIncludeRegexes.end(),
                 this->PreIncludeRegexes.begin(), TransformCompile);
  std::transform(preExcludeRegexes.begin(), preExcludeRegexes.end(),
                 this->PreExcludeRegexes.begin(), TransformCompile);
  std::transform(postIncludeRegexes.begin(), postIncludeRegexes.end(),
                 this->PostIncludeRegexes.begin(), TransformCompile);
  std::transform(postExcludeRegexes.begin(), postExcludeRegexes.end(),
                 this->PostExcludeRegexes.begin(), TransformCompile);
}